

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::ComplexOptionType3::ByteSizeLong(ComplexOptionType3 *this)

{
  uint uVar1;
  int32_t value;
  uint32_t *puVar2;
  size_t sVar3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  ComplexOptionType3 *this_;
  ComplexOptionType3 *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sStack_58 = google::protobuf::internal::WireFormatLite::
                  GroupSize<proto2_unittest::ComplexOptionType3_ComplexOptionType5>
                            ((this->field_0)._impl_.complexoptiontype5_);
      sStack_58 = sStack_58 + 2;
    }
    if ((uVar1 & 2) != 0) {
      value = _internal_moo(this);
      sVar3 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
      sStack_58 = sVar3 + sStack_58;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t ComplexOptionType3::ByteSizeLong() const {
  const ComplexOptionType3& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.ComplexOptionType3)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional group ComplexOptionType5 = 2 { ... };
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.complexoptiontype5_);
    }
    // optional int32 moo = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_moo());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}